

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trivialre_test.cc
# Opt level: O2

bool CompilationFails(string_view str)

{
  undefined1 uVar1;
  undefined8 local_b8 [4];
  string local_98 [8];
  string result;
  char local_58;
  long local_50;
  undefined1 local_40 [8];
  string_view str_local;
  allocator<char> local_19;
  
  str_local._M_len = (size_t)str._M_str;
  local_40 = (undefined1  [8])str._M_len;
  str_local._M_str._0_1_ = 0;
  trivialre::re_compiler::
  C<StringTestingBuilder,CompilationFails(std::basic_string_view<char,std::char_traits<char>>)::Policy>
  ::ParseAlt_abi_cxx11_((ParseResult *)((long)&result.field_2 + 8),&str_local._M_str,str);
  if (local_50 != 0) {
    str_local._M_str._0_1_ = 1;
  }
  if (local_58 == '\0') {
    StringTestingBuilder::Any_abi_cxx11_();
  }
  else {
    std::__cxx11::string::string(local_98,(string *)(result.field_2._M_local_buf + 8));
  }
  std::
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::_M_reset((_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)((long)&result.field_2 + 8));
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            ((string *)(result.field_2._M_local_buf + 8),
             (basic_string_view<char,_std::char_traits<char>_> *)local_40,&local_19);
  std::__cxx11::string::string((string *)local_b8,local_98);
  printf("for failing: %s -> %s\n",result.field_2._8_8_,local_b8[0]);
  std::__cxx11::string::~string((string *)local_b8);
  std::__cxx11::string::~string((string *)(result.field_2._M_local_buf + 8));
  uVar1 = str_local._M_str._0_1_;
  std::__cxx11::string::~string(local_98);
  return (bool)uVar1;
}

Assistant:

bool CompilationFails(std::string_view str) {
  struct Policy {
    bool failed{};
    void NoteError(std::string_view msg, std::string_view at) { failed = true; }
    void StartedParsing(std::string_view str) {}
  };
  trivialre::re_compiler::C<StringTestingBuilder, Policy> compiler({});
  std::string result = compiler.CompileOrDie(str);
  printf("for failing: %s -> %s\n", std::string(str).c_str(), std::string(result).c_str());
  return compiler.failed;
}